

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void duckdb::MaxOperation::Combine<duckdb::MinMaxState<duckdb::interval_t>,duckdb::MaxOperation>
               (MinMaxState<duckdb::interval_t> *source,MinMaxState<duckdb::interval_t> *target,
               AggregateInputData *param_3)

{
  long lVar1;
  long lVar2;
  int64_t iVar3;
  undefined7 uVar4;
  int32_t iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (source->isset == true) {
    if (target->isset == false) {
      uVar4 = *(undefined7 *)&source->field_0x11;
      target->isset = source->isset;
      *(undefined7 *)&target->field_0x11 = uVar4;
    }
    else {
      lVar1 = (source->value).micros;
      lVar8 = (long)(source->value).days + lVar1 / 86400000000;
      lVar9 = lVar8 % 0x1e;
      lVar2 = (target->value).micros;
      lVar7 = (long)(source->value).months + lVar8 / 0x1e;
      lVar6 = (long)(target->value).days + lVar2 / 86400000000;
      lVar8 = lVar6 % 0x1e;
      lVar6 = (long)(target->value).months + lVar6 / 0x1e;
      if (lVar7 <= lVar6) {
        if (lVar7 < lVar6) {
          return;
        }
        if (lVar9 <= lVar8) {
          if (lVar9 < lVar8) {
            return;
          }
          if (lVar1 % 86400000000 <= lVar2 % 86400000000) {
            return;
          }
        }
      }
    }
    iVar5 = (source->value).days;
    iVar3 = (source->value).micros;
    (target->value).months = (source->value).months;
    (target->value).days = iVar5;
    (target->value).micros = iVar3;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (LessThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}